

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

int __thiscall icu_63::Locale::init(Locale *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  byte *__src;
  int iVar2;
  Locale *other;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  byte *__s;
  char in_DL;
  int32_t iVar6;
  int iVar7;
  size_t __n;
  ulong uVar8;
  UErrorCode err;
  int32_t fieldLen [5];
  byte *apbStack_50 [4];
  
  this->fIsBogus = '\0';
  pcVar3 = this->fullName;
  if (this->baseName != pcVar3) {
    uprv_free_63(this->baseName);
    pcVar3 = this->fullName;
  }
  this->baseName = (char *)0x0;
  pcVar4 = this->fullNameBuffer;
  if (pcVar3 != pcVar4) {
    uprv_free_63(pcVar3);
    this->fullName = pcVar4;
    pcVar3 = pcVar4;
  }
  apbStack_50[1] = (byte *)0x0;
  apbStack_50[2] = (byte *)0x0;
  apbStack_50[0] = (byte *)0x0;
  apbStack_50[3] = (byte *)0x0;
  fieldLen[0] = 0;
  fieldLen[1] = 0;
  fieldLen[2] = 0;
  fieldLen[3] = 0;
  fieldLen[4] = 0;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    other = getDefault();
    operator=(this,other);
    goto LAB_00172e8f;
  }
  this->country[0] = '\0';
  this->script[0] = '\0';
  this->language[0] = '\0';
  err = U_ZERO_ERROR;
  if (in_DL == '\0') {
    iVar2 = uloc_getName_63((char *)ctx,pcVar3,0x9d,&err);
  }
  else {
    iVar2 = uloc_canonicalize_63((char *)ctx,pcVar3,0x9d,&err);
  }
  if ((err == U_BUFFER_OVERFLOW_ERROR) || (0x9c < iVar2)) {
    iVar2 = iVar2 + 1;
    pcVar3 = (char *)uprv_malloc_63((long)iVar2);
    this->fullName = pcVar3;
    if (pcVar3 != (char *)0x0) {
      err = U_ZERO_ERROR;
      if (in_DL == '\0') {
        iVar2 = uloc_getName_63((char *)ctx,pcVar3,iVar2,&err);
      }
      else {
        iVar2 = uloc_canonicalize_63((char *)ctx,pcVar3,iVar2,&err);
      }
      goto LAB_00172cf4;
    }
    this->fullName = pcVar4;
  }
  else {
LAB_00172cf4:
    if (err != U_STRING_NOT_TERMINATED_WARNING && err < U_ILLEGAL_ARGUMENT_ERROR) {
      this->variantBegin = iVar2;
      __src = (byte *)this->fullName;
      uVar8 = 1;
      __s = __src;
      while( true ) {
        pcVar3 = strchr((char *)__s,0x5f);
        iVar7 = (int)__s;
        if ((3 < uVar8) || (pcVar3 == (char *)0x0)) break;
        __s = (byte *)(pcVar3 + 1);
        apbStack_50[uVar8 - 1] = __s;
        fieldLen[uVar8 - 1] = (int)pcVar3 - iVar7;
        uVar8 = uVar8 + 1;
      }
      pcVar3 = strchr((char *)__s,0x40);
      pcVar4 = strchr((char *)__s,0x2e);
      if (pcVar3 == (char *)0x0 && pcVar4 == (char *)0x0) {
        iVar6 = iVar2 + ((int)__src - iVar7);
      }
      else {
        pcVar5 = pcVar3;
        if (pcVar4 < pcVar3) {
          pcVar5 = pcVar4;
        }
        if (pcVar4 == (char *)0x0) {
          pcVar5 = pcVar3;
        }
        iVar2 = (int)pcVar5;
        if (pcVar3 == (char *)0x0) {
          iVar2 = (int)pcVar4;
        }
        iVar6 = iVar2 - iVar7;
      }
      fieldLen[uVar8 - 1] = iVar6;
      __n = (size_t)fieldLen[0];
      if ((long)__n < 0xc) {
        if (0 < fieldLen[0]) {
          memcpy(this->language,__src,__n);
          this->language[__n] = '\0';
        }
        uVar8 = 1;
        if ((((fieldLen[1] == 4) && ((byte)((*apbStack_50[0] & 0xdf) + 0xbf) < 0x1a)) &&
            ((byte)((apbStack_50[0][1] & 0xdf) + 0xbf) < 0x1a)) &&
           (((byte)((apbStack_50[0][2] & 0xdf) + 0xbf) < 0x1a &&
            ((byte)((apbStack_50[0][3] & 0xdf) + 0xbf) < 0x1a)))) {
          *(undefined4 *)this->script = *(undefined4 *)apbStack_50[0];
          this->script[4] = '\0';
          uVar8 = 2;
        }
        uVar1 = fieldLen[uVar8];
        if (uVar1 - 2 < 2) {
          memcpy(this->country,apbStack_50[uVar8 - 1],(ulong)uVar1);
          this->country[uVar1] = '\0';
LAB_00172e58:
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        else if (uVar1 == 0) goto LAB_00172e58;
        if (0 < fieldLen[uVar8]) {
          this->variantBegin = *(int *)(apbStack_50 + (uVar8 - 1)) - *(int *)&this->fullName;
        }
        err = U_ZERO_ERROR;
        initBaseName(this,&err);
        if (err < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00172e8f;
      }
    }
  }
  setToBogus(this);
LAB_00172e8f:
  return (int)this;
}

Assistant:

Locale& Locale::init(const char* localeID, UBool canonicalize)
{
    fIsBogus = FALSE;
    /* Free our current storage */
    if (baseName != fullName) {
        uprv_free(baseName);
    }
    baseName = NULL;
    if(fullName != fullNameBuffer) {
        uprv_free(fullName);
        fullName = fullNameBuffer;
    }

    // not a loop:
    // just an easy way to have a common error-exit
    // without goto and without another function
    do {
        char *separator;
        char *field[5] = {0};
        int32_t fieldLen[5] = {0};
        int32_t fieldIdx;
        int32_t variantField;
        int32_t length;
        UErrorCode err;

        if(localeID == NULL) {
            // not an error, just set the default locale
            return *this = getDefault();
        }

        /* preset all fields to empty */
        language[0] = script[0] = country[0] = 0;

        // "canonicalize" the locale ID to ICU/Java format
        err = U_ZERO_ERROR;
        length = canonicalize ?
            uloc_canonicalize(localeID, fullName, sizeof(fullNameBuffer), &err) :
            uloc_getName(localeID, fullName, sizeof(fullNameBuffer), &err);

        if(err == U_BUFFER_OVERFLOW_ERROR || length >= (int32_t)sizeof(fullNameBuffer)) {
            /*Go to heap for the fullName if necessary*/
            fullName = (char *)uprv_malloc(sizeof(char)*(length + 1));
            if(fullName == 0) {
                fullName = fullNameBuffer;
                break; // error: out of memory
            }
            err = U_ZERO_ERROR;
            length = canonicalize ?
                uloc_canonicalize(localeID, fullName, length+1, &err) :
                uloc_getName(localeID, fullName, length+1, &err);
        }
        if(U_FAILURE(err) || err == U_STRING_NOT_TERMINATED_WARNING) {
            /* should never occur */
            break;
        }

        variantBegin = length;

        /* after uloc_getName/canonicalize() we know that only '_' are separators */
        separator = field[0] = fullName;
        fieldIdx = 1;
        while ((separator = uprv_strchr(field[fieldIdx-1], SEP_CHAR)) != 0 && fieldIdx < UPRV_LENGTHOF(field)-1) {
            field[fieldIdx] = separator + 1;
            fieldLen[fieldIdx-1] = (int32_t)(separator - field[fieldIdx-1]);
            fieldIdx++;
        }
        // variant may contain @foo or .foo POSIX cruft; remove it
        separator = uprv_strchr(field[fieldIdx-1], '@');
        char* sep2 = uprv_strchr(field[fieldIdx-1], '.');
        if (separator!=NULL || sep2!=NULL) {
            if (separator==NULL || (sep2!=NULL && separator > sep2)) {
                separator = sep2;
            }
            fieldLen[fieldIdx-1] = (int32_t)(separator - field[fieldIdx-1]);
        } else {
            fieldLen[fieldIdx-1] = length - (int32_t)(field[fieldIdx-1] - fullName);
        }

        if (fieldLen[0] >= (int32_t)(sizeof(language)))
        {
            break; // error: the language field is too long
        }

        variantField = 1; /* Usually the 2nd one, except when a script or country is also used. */
        if (fieldLen[0] > 0) {
            /* We have a language */
            uprv_memcpy(language, fullName, fieldLen[0]);
            language[fieldLen[0]] = 0;
        }
        if (fieldLen[1] == 4 && ISASCIIALPHA(field[1][0]) &&
                ISASCIIALPHA(field[1][1]) && ISASCIIALPHA(field[1][2]) &&
                ISASCIIALPHA(field[1][3])) {
            /* We have at least a script */
            uprv_memcpy(script, field[1], fieldLen[1]);
            script[fieldLen[1]] = 0;
            variantField++;
        }

        if (fieldLen[variantField] == 2 || fieldLen[variantField] == 3) {
            /* We have a country */
            uprv_memcpy(country, field[variantField], fieldLen[variantField]);
            country[fieldLen[variantField]] = 0;
            variantField++;
        } else if (fieldLen[variantField] == 0) {
            variantField++; /* script or country empty but variant in next field (i.e. en__POSIX) */
        }

        if (fieldLen[variantField] > 0) {
            /* We have a variant */
            variantBegin = (int32_t)(field[variantField] - fullName);
        }

        err = U_ZERO_ERROR;
        initBaseName(err);
        if (U_FAILURE(err)) {
            break;
        }

        // successful end of init()
        return *this;
    } while(0); /*loop doesn't iterate*/

    // when an error occurs, then set this object to "bogus" (there is no UErrorCode here)
    setToBogus();

    return *this;
}